

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O1

string * tinyusdz::print_typed_attr<tinyusdz::Extent>
                   (string *__return_storage_ptr__,
                   TypedAttribute<tinyusdz::Animatable<tinyusdz::Extent>_> *attr,string *name,
                   uint32_t indent)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  pointer pPVar3;
  Path *v;
  undefined8 uVar4;
  undefined8 uVar5;
  Extent v_00;
  ulong uVar6;
  byte bVar7;
  byte bVar8;
  bool bVar9;
  bool bVar10;
  ostream *poVar11;
  undefined4 in_register_0000000c;
  pointer pPVar12;
  uint32_t n;
  uint32_t n_00;
  uint32_t extraout_EDX;
  uint32_t extraout_EDX_00;
  uint32_t n_01;
  long lVar13;
  char *pcVar14;
  uint32_t uVar15;
  bool bVar16;
  bool bVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  stringstream ss;
  string local_290;
  undefined4 local_26c;
  string *local_268;
  undefined4 local_25c;
  undefined4 local_258;
  undefined4 local_254;
  undefined4 local_250;
  undefined4 local_24c;
  ulong local_248;
  byte local_240;
  undefined8 local_238;
  undefined2 uStack_230;
  undefined2 uStack_22e;
  undefined4 uStack_22c;
  undefined2 uStack_228;
  undefined2 uStack_226;
  undefined4 uStack_224;
  byte bStack_220;
  char cStack_21f;
  TypedTimeSamples<tinyusdz::Extent> local_218;
  undefined4 local_1f8;
  undefined4 uStack_1f4;
  undefined4 uStack_1f0;
  undefined4 uStack_1ec;
  undefined4 local_1e8;
  undefined4 uStack_1e4;
  string *local_1e0;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_248 = CONCAT44(in_register_0000000c,indent);
  local_268 = name;
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  bVar10 = (attr->_attrib).has_value_;
  if ((((bVar10 == false) &&
       ((attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
        super__Vector_impl_data._M_start)) && (attr->_value_empty == false)) &&
     (attr->_blocked != true)) goto LAB_00311c26;
  pPVar3 = (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pPVar12 = (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if ((pPVar12 == pPVar3 && bVar10 == false) && (attr->_blocked == false)) {
    cVar2 = attr->_value_empty;
  }
  else {
    cVar2 = '\0';
  }
  bVar16 = pPVar12 != pPVar3;
  local_240 = bVar10;
  local_1e0 = __return_storage_ptr__;
  if ((bVar10 ^ 1U) == 0) {
    local_238 = *(undefined8 *)&(attr->_attrib).contained;
    uVar4 = *(undefined8 *)((long)&(attr->_attrib).contained + 8);
    uVar5 = *(undefined8 *)((long)&(attr->_attrib).contained + 0x12);
    uStack_228 = (undefined2)((ulong)*(undefined8 *)((long)&(attr->_attrib).contained + 10) >> 0x30)
    ;
    uStack_226 = (undefined2)uVar5;
    uStack_224 = (undefined4)((ulong)uVar5 >> 0x10);
    bStack_220 = (byte)((ulong)uVar5 >> 0x30);
    cStack_21f = (char)((ulong)uVar5 >> 0x38);
    uStack_230 = (undefined2)uVar4;
    uStack_22e = (undefined2)((ulong)uVar4 >> 0x10);
    uStack_22c = (undefined4)((ulong)uVar4 >> 0x20);
    ::std::
    vector<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample>_>
    ::vector(&local_218._samples,
             (vector<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample>_>
              *)((long)&(attr->_attrib).contained + 0x20));
    local_218._dirty = *(bool *)((long)&(attr->_attrib).contained + 0x38);
  }
  bVar8 = bStack_220;
  bVar7 = local_240;
  uVar15 = (uint32_t)pPVar12;
  if (local_240 == 1) {
    if (local_218._dirty == true) {
      TypedTimeSamples<tinyusdz::Extent>::update(&local_218);
    }
    local_26c = (undefined4)
                CONCAT71((int7)((ulong)local_218._samples.
                                       super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample>_>
                                       ._M_impl.super__Vector_impl_data._M_finish >> 8),
                         local_218._samples.
                         super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample>_>
                         ._M_impl.super__Vector_impl_data._M_finish !=
                         local_218._samples.
                         super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample>_>
                         ._M_impl.super__Vector_impl_data._M_start);
  }
  else {
    local_26c = 0;
  }
  if (((local_240 == 1) && (cStack_21f == '\0')) && (bStack_220 == 0)) {
    bVar17 = local_218._samples.
             super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             local_218._samples.
             super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    bVar17 = false;
  }
  bVar9 = AttrMetas::authored(&attr->_metas);
  uVar6 = local_248;
  if (((bVar9) || ((byte)(bVar16 & (bVar10 ^ 1U) | bVar17) != 1)) ||
     (n_01 = n, (cVar2 != '\0' || attr->_blocked != false) || (bVar7 & bVar8) != 0)) {
    pprint::Indent_abi_cxx11_(&local_290,(pprint *)(local_248 & 0xffffffff),n);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_290._M_dataplus._M_p,local_290._M_string_length);
    paVar1 = &local_290.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != paVar1) {
      operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
    }
    local_290.field_2._M_allocated_capacity = 0x5d5b3374616f6c66;
    local_290._M_string_length = 8;
    local_290.field_2._M_local_buf[8] = '\0';
    local_290._M_dataplus._M_p = (pointer)paVar1;
    poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,paVar1->_M_local_buf,8)
    ;
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (poVar11,(local_268->_M_dataplus)._M_p,local_268->_M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != paVar1) {
      operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
    }
    if (attr->_blocked == true) {
      pcVar14 = " = None";
      lVar13 = 7;
LAB_00311736:
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,pcVar14,lVar13);
    }
    else if ((bVar7 & bVar8) != 0) {
      if (local_240 == 0) goto LAB_00311c96;
      uVar18 = 0x7f800000;
      uVar19 = 0xff800000;
      if ((cStack_21f == '\0') && (bStack_220 == 1)) {
        uVar18 = CONCAT22(uStack_22e,uStack_230);
        uVar20 = CONCAT22(uStack_226,uStack_228);
        bVar10 = true;
        uVar19 = uStack_224;
        uVar21 = uStack_22c;
        uVar22 = local_238._4_4_;
        uVar23 = (undefined4)local_238;
      }
      else {
        bVar10 = false;
        uVar20 = 0xff800000;
        uVar21 = 0xff800000;
        uVar22 = 0x7f800000;
        uVar23 = 0x7f800000;
      }
      if (!bVar10) {
        pcVar14 = " = [InternalError]";
        lVar13 = 0x12;
        goto LAB_00311736;
      }
      local_25c = uVar23;
      local_258 = uVar22;
      local_254 = uVar21;
      local_250 = uVar18;
      local_24c = uVar20;
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8," = ",3);
      local_1f8 = local_25c;
      uStack_1f4 = local_258;
      uStack_1f0 = local_250;
      uStack_1ec = local_254;
      local_1e8 = local_24c;
      v_00.upper._M_elems[2] = (float)uVar19;
      v_00.upper._M_elems[1] = (float)local_24c;
      v_00.lower._M_elems[1] = (float)local_258;
      v_00.lower._M_elems[0] = (float)local_25c;
      v_00.upper._M_elems[0] = (float)local_254;
      v_00.lower._M_elems[2] = (float)local_250;
      uStack_1e4 = uVar19;
      ::std::operator<<(local_1a8,v_00);
    }
    bVar10 = AttrMetas::authored(&attr->_metas);
    if (bVar10) {
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"(\n",2);
      print_attr_metas_abi_cxx11_
                (&local_290,(tinyusdz *)attr,(AttrMeta *)(ulong)((int)uVar6 + 1),uVar15);
      poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (local_1a8,local_290._M_dataplus._M_p,local_290._M_string_length);
      pprint::Indent_abi_cxx11_(&local_1d8,(pprint *)(uVar6 & 0xffffffff),n_00);
      poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar11,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar11,")",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p != paVar1) {
        operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
      }
    }
    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
    n_01 = extraout_EDX;
  }
  uVar6 = local_248;
  if ((char)local_26c != '\0') {
    uVar15 = (uint32_t)local_248;
    pprint::Indent_abi_cxx11_(&local_290,(pprint *)(local_248 & 0xffffffff),n_01);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_290._M_dataplus._M_p,local_290._M_string_length);
    paVar1 = &local_290.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != paVar1) {
      operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
    }
    local_290.field_2._M_allocated_capacity = 0x5d5b3374616f6c66;
    local_290._M_string_length = 8;
    local_290.field_2._M_local_buf[8] = '\0';
    local_290._M_dataplus._M_p = (pointer)paVar1;
    poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,paVar1->_M_local_buf,8)
    ;
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (poVar11,(local_268->_M_dataplus)._M_p,local_268->_M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != paVar1) {
      operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
    }
    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,".timeSamples = ",0xf);
    if (local_240 == 0) {
LAB_00311c96:
      __assert_fail("has_value()",
                    "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/nonstd/optional.hpp"
                    ,0x584,
                    "const value_type &nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::Extent>>::value() const [T = tinyusdz::Animatable<tinyusdz::Extent>]"
                   );
    }
    print_typed_timesamples<tinyusdz::Extent>(&local_290,&local_218,uVar15);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_290._M_dataplus._M_p,local_290._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != paVar1) {
      operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
    }
    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
    n_01 = extraout_EDX_00;
  }
  if ((attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
      super__Vector_impl_data._M_start) {
    pprint::Indent_abi_cxx11_(&local_290,(pprint *)(uVar6 & 0xffffffff),n_01);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_290._M_dataplus._M_p,local_290._M_string_length);
    paVar1 = &local_290.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != paVar1) {
      operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
    }
    local_290.field_2._M_allocated_capacity = 0x5d5b3374616f6c66;
    local_290._M_string_length = 8;
    local_290.field_2._M_local_buf[8] = '\0';
    local_290._M_dataplus._M_p = (pointer)paVar1;
    poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,paVar1->_M_local_buf,8)
    ;
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (poVar11,(local_268->_M_dataplus)._M_p,local_268->_M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != paVar1) {
      operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
    }
    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,".connect = ",0xb);
    v = (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
        super__Vector_impl_data._M_start;
    lVar13 = ((long)(attr->_paths).
                    super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)v >> 4) * 0x4ec4ec4ec4ec4ec5;
    if (lVar13 == 0) {
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"[InternalError]",0xf);
    }
    else if (lVar13 == 1) {
      ::std::operator<<(local_1a8,v);
    }
    else {
      ::std::operator<<(local_1a8,&attr->_paths);
    }
    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
  }
  __return_storage_ptr__ = local_1e0;
  if ((local_240 == 1) &&
     (local_218._samples.
      super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
    operator_delete(local_218._samples.
                    super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_218._samples.
                          super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_218._samples.
                          super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    __return_storage_ptr__ = local_1e0;
  }
LAB_00311c26:
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string print_typed_attr(const TypedAttribute<Animatable<T>> &attr,
                             const std::string &name, const uint32_t indent) {
  std::stringstream ss;

  if (attr.authored()) {

    bool is_value_empty = attr.is_value_empty();
    bool is_connection = attr.is_connection();
    bool has_default{false};
    bool has_timesamples{false};
    bool is_timesamples{false};
    const auto &pv = attr.get_value();

    has_default = (pv && pv.value().has_default());
    has_timesamples = (pv && pv.value().has_timesamples());
    is_timesamples = (pv && pv.value().is_timesamples());

    DCOUT("name " << name);
    DCOUT("is_value_empty " << is_value_empty);
    DCOUT("is_connection " << is_connection);
    DCOUT("is_timesamples " << is_timesamples);
    DCOUT("has_timesamples " << has_timesamples);
    DCOUT("has_default " << has_default);

    //
    // Emit default value(includes ValueBlock and empty definition) and metada
    //
    // float a METADATA
    // float a = None METADATA
    // float a = 1.5 METADATA
    // 
    // Also emit this line if the attribute contains metadata
    // Do not emit when Attribute is connection only or timesamples only.
    if (attr.metas().authored() || attr.is_blocked() || has_default || is_value_empty || ((!is_connection) && (!is_timesamples))) {

      ss << pprint::Indent(indent);
      ss << value::TypeTraits<T>::type_name() << " " << name;

      if (attr.is_blocked()) {
        ss << " = None";
      } else if (has_default) {
        T a;
        if (pv.value().get_scalar(&a)) {
          ss << " = " << a;
        } else {
          ss << " = [InternalError]";
        }
      } else { // is_value_empty
      }

      if (attr.metas().authored()) {
        ss << "(\n"
           << print_attr_metas(attr.metas(), indent + 1) << pprint::Indent(indent)
           << ")";
      }
      ss << "\n";
    }

    // timesamples
    if (has_timesamples) {
      ss << pprint::Indent(indent);
      ss << value::TypeTraits<T>::type_name() << " " << name;
      ss << ".timeSamples = "
         << print_typed_timesamples(pv.value().get_timesamples(), indent);
      ss << "\n";
    }

    // connection
    if (attr.has_connections()) {

      ss << pprint::Indent(indent);
      ss << value::TypeTraits<T>::type_name() << " " << name;

      ss << ".connect = ";
      const std::vector<Path> &paths = attr.get_connections();
      if (paths.size() == 1) {
        ss << paths[0];
      } else if (paths.size() == 0) {
        ss << "[InternalError]";
      } else {
        ss << paths;
      }
      ss << "\n";
    }

  }

  return ss.str();
}